

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int param_1,char **param_2)

{
  uint uVar1;
  result_type rVar2;
  long lVar3;
  long *plVar4;
  ostream *poVar5;
  ulong uVar6;
  int i_1;
  int iVar7;
  int i;
  bool bVar8;
  int new_payload_1;
  Iterator it;
  int new_key;
  uniform_int_distribution<int> dis;
  int new_payload;
  pair<int,_int> values [100];
  Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> index;
  mt19937_64 gen;
  int local_2104;
  pair<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::Iterator,_bool>
  local_2100;
  Iterator local_20e0;
  param_type local_20c8;
  Iterator local_20c0;
  V local_20a8 [101];
  anon_union_5000_2_650ea050_for_random_device_0 local_1d80;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  local_9f8;
  
  memset(local_20a8,0,800);
  std::random_device::random_device((random_device *)&local_1d80.field_0);
  uVar1 = std::random_device::_M_getval();
  local_9f8._M_x[0] = (unsigned_long)uVar1;
  lVar3 = 1;
  uVar6 = local_9f8._M_x[0];
  do {
    uVar6 = (uVar6 >> 0x3e ^ uVar6) * 0x5851f42d4c957f2d + lVar3;
    local_9f8._M_x[lVar3] = uVar6;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x138);
  local_9f8._M_p = 0x138;
  std::random_device::_M_fini();
  local_20c8._M_a = 0;
  local_20c8._M_b = 0x7fffffff;
  lVar3 = 0;
  do {
    local_20a8[lVar3].first = (int)lVar3;
    rVar2 = std::uniform_int_distribution<int>::operator()
                      ((uniform_int_distribution<int> *)&local_20c8,&local_9f8,&local_20c8);
    local_20a8[lVar3].second = rVar2;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 100);
  alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::Alex
            ((Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *)
             &local_1d80.field_0);
  iVar7 = 100;
  alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::bulk_load
            ((Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *)
             &local_1d80.field_0,local_20a8,100);
  do {
    local_20e0.cur_leaf_ = (data_node_type *)CONCAT44(local_20e0.cur_leaf_._4_4_,iVar7);
    local_20c0.cur_leaf_._0_4_ =
         std::uniform_int_distribution<int>::operator()
                   ((uniform_int_distribution<int> *)&local_20c8,&local_9f8,&local_20c8);
    alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::insert
              (&local_2100,
               (Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *)
               &local_1d80.field_0,(int *)&local_20e0,(int *)&local_20c0);
    iVar7 = iVar7 + 1;
  } while (iVar7 != 200);
  local_2100.first.cur_leaf_ =
       (data_node_type *)((ulong)local_2100.first.cur_leaf_ & 0xffffffff00000000);
  do {
    alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::erase
              ((Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *)
               &local_1d80.field_0,(int *)&local_2100);
    iVar7 = (int)local_2100.first.cur_leaf_;
    local_2100.first.cur_leaf_ =
         (data_node_type *)
         CONCAT44(local_2100.first.cur_leaf_._4_4_,(int)local_2100.first.cur_leaf_ + 1);
  } while (iVar7 < 9);
  if (*(char *)((long)local_1d80.field_0._M_file + 8) == '\0') {
    do {
      local_1d80.field_0._M_file =
           (((data_node_type *)local_1d80.field_0._M_file)->next_leaf_->super_AlexNode<int,_int>).
           _vptr_AlexNode;
    } while ((((data_node_type *)local_1d80.field_0._M_file)->super_AlexNode<int,_int>).is_leaf_ !=
             true);
  }
  local_2100.first.cur_idx_ = 0;
  local_2100.first.cur_bitmap_idx_ = 0;
  local_2100.first.cur_bitmap_data_ = 0;
  local_2100.first.cur_leaf_ = (data_node_type *)local_1d80.field_0._M_file;
  alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::Iterator::
  initialize(&local_2100.first);
  if (local_2100.first.cur_leaf_ != (data_node_type *)0x0 || local_2100.first.cur_idx_ != 0) {
    iVar7 = 0xbe;
    do {
      if ((*(byte *)((local_2100.first.cur_leaf_)->key_slots_ + local_2100.first.cur_idx_) & 1) == 0
         ) {
        rVar2 = std::uniform_int_distribution<int>::operator()
                          ((uniform_int_distribution<int> *)&local_20c8,&local_9f8,&local_20c8);
        (local_2100.first.cur_leaf_)->payload_slots_[local_2100.first.cur_idx_] = rVar2;
      }
      alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::Iterator
      ::operator++(&local_20e0,&local_2100.first,0);
      iVar7 = iVar7 + -1;
    } while (local_2100.first.cur_leaf_ != (data_node_type *)0x0 || local_2100.first.cur_idx_ != 0);
    if (iVar7 == 0) goto LAB_00102700;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Error! There should be 190 entries in the index.",0x30);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
  std::ostream::put(-0x38);
  std::ostream::flush();
LAB_00102700:
  local_20e0.cur_leaf_ = (data_node_type *)CONCAT44(local_20e0.cur_leaf_._4_4_,0x32);
  alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::lower_bound
            (&local_2100.first,
             (Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *)
             &local_1d80.field_0,(int *)&local_20e0);
  iVar7 = 0x32;
  while( true ) {
    local_20c0.cur_leaf_._0_4_ = 100;
    alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::lower_bound
              (&local_20e0,
               (Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *)
               &local_1d80.field_0,(int *)&local_20c0);
    if ((local_2100.first.cur_idx_ == local_20e0.cur_idx_) &&
       (local_2100.first.cur_leaf_ == local_20e0.cur_leaf_)) break;
    alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::Iterator::
    operator++(&local_20e0,&local_2100.first,0);
    iVar7 = iVar7 + -1;
  }
  if (iVar7 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "Error! There should be 50 entries with keys in the range [50, 100).",0x43);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
    std::ostream::put(-0x38);
    std::ostream::flush();
  }
  local_2100.first.cur_leaf_ = (data_node_type *)CONCAT44(local_2100.first.cur_leaf_._4_4_,0x32);
  alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::lower_bound
            (&local_20e0,
             (Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *)
             &local_1d80.field_0,(int *)&local_2100);
  lVar3 = (long)local_20e0.cur_idx_;
  iVar7 = 0;
  bVar8 = false;
  if ((local_20e0.cur_leaf_)->key_slots_[lVar3] < 100) {
    do {
      if (local_20e0.cur_leaf_ == (data_node_type *)0x0 && (int)lVar3 == 0) break;
      alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::Iterator
      ::operator++(&local_2100.first,&local_20e0,0);
      iVar7 = iVar7 + 1;
      lVar3 = (long)local_20e0.cur_idx_;
    } while ((local_20e0.cur_leaf_)->key_slots_[lVar3] < 100);
    bVar8 = iVar7 == 0x32;
  }
  if (!bVar8) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "Error! There should be 50 entries with keys in the range [50, 100).",0x43);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
    std::ostream::put(-0x38);
    std::ostream::flush();
  }
  iVar7 = 9;
  do {
    local_20c0.cur_leaf_._0_4_ = 0x2a;
    local_2104 = std::uniform_int_distribution<int>::operator()
                           ((uniform_int_distribution<int> *)&local_20c8,&local_9f8,&local_20c8);
    alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::insert
              (&local_2100,
               (Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *)
               &local_1d80.field_0,(int *)&local_20c0,&local_2104);
    iVar7 = iVar7 + -1;
  } while (iVar7 != 0);
  local_20c0.cur_leaf_._0_4_ = 0x2a;
  alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::lower_bound
            (&local_2100.first,
             (Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *)
             &local_1d80.field_0,(int *)&local_20c0);
  iVar7 = 10;
  while( true ) {
    local_2104 = 0x2a;
    alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::upper_bound
              (&local_20c0,
               (Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *)
               &local_1d80.field_0,&local_2104);
    if ((local_2100.first.cur_idx_ == local_20c0.cur_idx_) &&
       (local_2100.first.cur_leaf_ ==
        (data_node_type *)CONCAT44(local_20c0.cur_leaf_._4_4_,(result_type)local_20c0.cur_leaf_)))
    break;
    alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::Iterator::
    operator++(&local_20c0,&local_2100.first,0);
    iVar7 = iVar7 + -1;
  }
  if (iVar7 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Error! There should be 10 entries with key of value 42.",0x37)
    ;
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
    std::ostream::put(-0x38);
    std::ostream::flush();
  }
  local_20c0.cur_leaf_._0_4_ = 0x539;
  alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::find
            (&local_2100.first,
             (Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *)
             &local_1d80.field_0,(int *)&local_20c0);
  local_20e0.cur_leaf_ = local_2100.first.cur_leaf_;
  local_20e0.cur_idx_ = local_2100.first.cur_idx_;
  local_20e0.cur_bitmap_idx_ = local_2100.first.cur_bitmap_idx_;
  local_20e0.cur_bitmap_data_ = local_2100.first.cur_bitmap_data_;
  if (local_2100.first.cur_leaf_ != (data_node_type *)0x0 || local_2100.first.cur_idx_ != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Error! Key with value 1337 should not exist.",0x2c);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
    std::ostream::put(-0x38);
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Final num keys: ",0x10);
  plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_1d80._40_4_);
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Num inserts: ",0xd);
  poVar5 = std::ostream::_M_insert<long_long>((longlong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::~Alex
            ((Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *)
             &local_1d80.field_0);
  return 0;
}

Assistant:

int main(int, char**) {
  // Create some synthetic data: keys are dense integers between 0 and 99, and
  // payloads are random values
  const int num_keys = 100;
  std::pair<KEY_TYPE, PAYLOAD_TYPE> values[num_keys];
  std::mt19937_64 gen(std::random_device{}());
  std::uniform_int_distribution<PAYLOAD_TYPE> dis;
  for (int i = 0; i < num_keys; i++) {
    values[i].first = i;
    values[i].second = dis(gen);
  }

  alex::Alex<KEY_TYPE, PAYLOAD_TYPE> index;

  // Bulk load the keys [0, 100)
  index.bulk_load(values, num_keys);

  // Insert the keys [100, 200). Now there are 200 keys.
  for (int i = num_keys; i < 2 * num_keys; i++) {
    KEY_TYPE new_key = i;
    PAYLOAD_TYPE new_payload = dis(gen);
    index.insert(new_key, new_payload);
  }

  // Erase the keys [0, 10). Now there are 190 keys.
  for (int i = 0; i < 10; i++) {
    index.erase(i);
  }

  // Iterate through all entries in the index and update their payload if the
  // key is even
  int num_entries = 0;
  for (auto it = index.begin(); it != index.end(); it++) {
    if (it.key() % 2 == 0) {  // it.key() is equivalent to (*it).first
      it.payload() = dis(gen);
    }
    num_entries++;
  }
  if (num_entries != 190) {
    std::cout << "Error! There should be 190 entries in the index."
              << std::endl;
  }

  // Iterate through all entries with keys between 50 (inclusive) and 100
  // (exclusive)
  num_entries = 0;
  for (auto it = index.lower_bound(50); it != index.lower_bound(100); it++) {
    num_entries++;
  }
  if (num_entries != 50) {
    std::cout
        << "Error! There should be 50 entries with keys in the range [50, 100)."
        << std::endl;
  }

  // Equivalent way of iterating through all entries with keys between 50
  // (inclusive) and 100 (exclusive)
  num_entries = 0;
  auto it = index.lower_bound(50);
  while (it.key() < 100 && it != index.end()) {
    num_entries++;
    it++;
  }
  if (num_entries != 50) {
    std::cout
        << "Error! There should be 50 entries with keys in the range [50, 100)."
        << std::endl;
  }

  // Insert 9 more keys with value 42. Now there are 199 keys.
  for (int i = 0; i < 9; i++) {
    KEY_TYPE new_key = 42;
    PAYLOAD_TYPE new_payload = dis(gen);
    index.insert(new_key, new_payload);
  }

  // Iterate through all 10 entries with keys of value 42
  int num_duplicates = 0;
  for (auto it = index.lower_bound(42); it != index.upper_bound(42); it++) {
    num_duplicates++;
  }
  if (num_duplicates != 10) {
    std::cout << "Error! There should be 10 entries with key of value 42."
              << std::endl;
  }

  // Check if a non-existent key exists
  it = index.find(1337);
  if (it != index.end()) {
    std::cout << "Error! Key with value 1337 should not exist." << std::endl;
  }

  // Look at some stats
  auto stats = index.get_stats();
  std::cout << "Final num keys: " << stats.num_keys
            << std::endl;  // expected: 199
  std::cout << "Num inserts: " << stats.num_inserts
            << std::endl;  // expected: 109
}